

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int delete_property(JSContext *ctx,JSObject *p,JSAtom atom)

{
  JSShape *pJVar1;
  long lVar2;
  JSValue v;
  int iVar3;
  uint uVar4;
  BOOL BVar5;
  ulong uVar6;
  uint32_t *puVar7;
  JSObject *p_00;
  JSContext *pJVar8;
  JSShapeProperty *pJVar9;
  long *plVar10;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  JSClassExoticMethods *em;
  uint32_t idx;
  intptr_t h1;
  intptr_t h;
  uint32_t lpr_idx;
  JSProperty *pr1;
  JSShapeProperty *prop;
  JSShapeProperty *lpr;
  JSShapeProperty *pr;
  JSShape *sh;
  JSAtom in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  JSAtom in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  JSContext *in_stack_ffffffffffffff78;
  JSRuntime *in_stack_ffffffffffffff80;
  uint local_74;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  JSContext *in_stack_ffffffffffffff98;
  ulong local_58;
  uint local_4c;
  JSContext *ctx_00;
  
  do {
    pJVar1 = *(JSShape **)(in_RSI + 0x18);
    uVar6 = (ulong)(in_EDX & pJVar1->prop_hash_mask);
    puVar7 = prop_hash_end(pJVar1);
    uVar4 = puVar7[-1 - uVar6];
    p_00 = (JSObject *)get_shape_prop(pJVar1);
    local_4c = 0;
    ctx_00 = (JSContext *)0x0;
    while (local_58 = (ulong)uVar4, local_58 != 0) {
      pJVar8 = (JSContext *)((long)p_00 + (local_58 - 1) * 8);
      if (*(JSAtom *)&(pJVar8->header).field_0x4 == in_EDX) {
        if (((uint)(pJVar8->header).ref_count >> 0x1a & 1) == 0) {
          return 0;
        }
        if (ctx_00 != (JSContext *)0x0) {
          in_stack_ffffffffffffff68 = SUB84(ctx_00,0);
          in_stack_ffffffffffffff6c = (JSAtom)((ulong)ctx_00 >> 0x20);
          pJVar9 = get_shape_prop(pJVar1);
          local_4c = (uint)(CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68) -
                            (long)pJVar9 >> 3);
        }
        iVar3 = js_shape_prepare_update
                          (in_stack_ffffffffffffff78,
                           (JSObject *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                           ,(JSShapeProperty **)
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        if (iVar3 == 0) {
          pJVar1 = *(JSShape **)(in_RSI + 0x18);
          if (ctx_00 == (JSContext *)0x0) {
            in_stack_ffffffffffffff64 = (pJVar8->header).ref_count & 0x3ffffff;
            puVar7 = prop_hash_end(pJVar1);
            puVar7[-1 - uVar6] = in_stack_ffffffffffffff64;
          }
          else {
            pJVar9 = get_shape_prop(pJVar1);
            ctx_00 = (JSContext *)(pJVar9 + local_4c);
            (ctx_00->header).ref_count =
                 (ctx_00->header).ref_count & 0xfc000000U | (pJVar8->header).ref_count & 0x3ffffffU;
          }
          pJVar1->deleted_prop_count = pJVar1->deleted_prop_count + 1;
          plVar10 = (long *)(*(long *)(in_RSI + 0x20) + (local_58 - 1) * 0x10);
          free_property(in_stack_ffffffffffffff80,(JSProperty *)in_stack_ffffffffffffff78,
                        in_stack_ffffffffffffff74);
          JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c);
          (pJVar8->header).ref_count = (pJVar8->header).ref_count & 0x3ffffff;
          *(JSAtom *)&(pJVar8->header).field_0x4 = 0;
          *plVar10 = (ulong)in_stack_ffffffffffffff94 << 0x20;
          plVar10[1] = 3;
          if ((7 < pJVar1->deleted_prop_count) &&
             ((uint)pJVar1->prop_count >> 1 <= (uint)pJVar1->deleted_prop_count)) {
            compact_properties(ctx_00,p_00);
          }
          return 1;
        }
        return -1;
      }
      ctx_00 = pJVar8;
      uVar4 = (pJVar8->header).ref_count & 0x3ffffff;
    }
    if ((*(byte *)(in_RSI + 5) >> 2 & 1) == 0) {
      return 1;
    }
    if ((*(byte *)(in_RSI + 5) >> 3 & 1) == 0) {
      lVar2 = *(long *)(*(long *)(*(long *)(in_RDI + 0x18) + 0x70) +
                        (ulong)*(ushort *)(in_RSI + 6) * 0x28 + 0x20);
      if (lVar2 == 0) {
        return 1;
      }
      if (*(long *)(lVar2 + 0x10) == 0) {
        return 1;
      }
      iVar3 = (**(code **)(lVar2 + 0x10))(in_RDI,in_RSI,0xffffffffffffffff,in_EDX);
      return iVar3;
    }
    BVar5 = JS_AtomIsArrayIndex(in_stack_ffffffffffffff78,
                                (uint32_t *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c);
    if (BVar5 == 0) {
      return 1;
    }
    if (*(uint *)(in_RSI + 0x40) <= local_74) {
      return 1;
    }
    if ((*(short *)(in_RSI + 6) != 2) && (*(short *)(in_RSI + 6) != 8)) {
      return 0;
    }
    if (local_74 == *(int *)(in_RSI + 0x40) - 1U) {
      v.u._4_4_ = in_stack_ffffffffffffff6c;
      v.u.int32 = in_stack_ffffffffffffff68;
      v.tag._0_4_ = in_stack_ffffffffffffff70;
      v.tag._4_4_ = in_stack_ffffffffffffff74;
      JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),v);
      *(uint *)(in_RSI + 0x40) = local_74;
      return 1;
    }
    iVar3 = convert_fast_array_to_array
                      (in_stack_ffffffffffffff98,
                       (JSObject *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  } while (iVar3 == 0);
  return -1;
}

Assistant:

static int delete_property(JSContext *ctx, JSObject *p, JSAtom atom)
{
    JSShape *sh;
    JSShapeProperty *pr, *lpr, *prop;
    JSProperty *pr1;
    uint32_t lpr_idx;
    intptr_t h, h1;

 redo:
    sh = p->shape;
    h1 = atom & sh->prop_hash_mask;
    h = prop_hash_end(sh)[-h1 - 1];
    prop = get_shape_prop(sh);
    lpr = NULL;
    lpr_idx = 0;   /* prevent warning */
    while (h != 0) {
        pr = &prop[h - 1];
        if (likely(pr->atom == atom)) {
            /* found ! */
            if (!(pr->flags & JS_PROP_CONFIGURABLE))
                return FALSE;
            /* realloc the shape if needed */
            if (lpr)
                lpr_idx = lpr - get_shape_prop(sh);
            if (js_shape_prepare_update(ctx, p, &pr))
                return -1;
            sh = p->shape;
            /* remove property */
            if (lpr) {
                lpr = get_shape_prop(sh) + lpr_idx;
                lpr->hash_next = pr->hash_next;
            } else {
                prop_hash_end(sh)[-h1 - 1] = pr->hash_next;
            }
            sh->deleted_prop_count++;
            /* free the entry */
            pr1 = &p->prop[h - 1];
            free_property(ctx->rt, pr1, pr->flags);
            JS_FreeAtom(ctx, pr->atom);
            /* put default values */
            pr->flags = 0;
            pr->atom = JS_ATOM_NULL;
            pr1->u.value = JS_UNDEFINED;

            /* compact the properties if too many deleted properties */
            if (sh->deleted_prop_count >= 8 &&
                sh->deleted_prop_count >= ((unsigned)sh->prop_count / 2)) {
                compact_properties(ctx, p);
            }
            return TRUE;
        }
        lpr = pr;
        h = pr->hash_next;
    }

    if (p->is_exotic) {
        if (p->fast_array) {
            uint32_t idx;
            if (JS_AtomIsArrayIndex(ctx, &idx, atom) &&
                idx < p->u.array.count) {
                if (p->class_id == JS_CLASS_ARRAY ||
                    p->class_id == JS_CLASS_ARGUMENTS) {
                    /* Special case deleting the last element of a fast Array */
                    if (idx == p->u.array.count - 1) {
                        JS_FreeValue(ctx, p->u.array.u.values[idx]);
                        p->u.array.count = idx;
                        return TRUE;
                    }
                    if (convert_fast_array_to_array(ctx, p))
                        return -1;
                    goto redo;
                } else {
                    return FALSE;
                }
            }
        } else {
            const JSClassExoticMethods *em = ctx->rt->class_array[p->class_id].exotic;
            if (em && em->delete_property) {
                return em->delete_property(ctx, JS_MKPTR(JS_TAG_OBJECT, p), atom);
            }
        }
    }
    /* not found */
    return TRUE;
}